

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winfnt.c
# Opt level: O0

FT_Error fnt_face_get_dll_font(FNT_Face face,FT_Int face_instance_index)

{
  FT_Stream stream_00;
  FT_UInt16 FVar1;
  FT_UInt16 FVar2;
  FT_UInt16 FVar3;
  FT_Error FVar4;
  FT_ULong FVar5;
  FNT_Font pFVar6;
  long lVar7;
  long lVar8;
  uint local_15c;
  ushort local_156;
  ushort local_154;
  ushort local_152;
  FT_UShort k;
  FT_UShort j;
  FT_UShort i;
  FT_ULong lang_dir_offset;
  FT_ULong name_dir_offset;
  FT_ULong root_dir_offset;
  WinPE_RsrcDataEntryRec data_entry;
  WinPE_RsrcDirEntryRec dir_entry3;
  WinPE_RsrcDirEntryRec dir_entry2;
  WinPE_RsrcDirEntryRec dir_entry1;
  WinPE_RsrcDirRec lang_dir;
  WinPE_RsrcDirRec name_dir;
  WinPE_RsrcDirRec root_dir;
  WinPE32_SectionRec pe32_section;
  WinPE32_HeaderRec pe32_header;
  FT_UShort count;
  uchar *puStack_58;
  FT_UShort type_id;
  FT_ULong font_offset;
  FT_UShort font_count;
  FT_UShort size_shift;
  FT_ULong res_offset;
  long lStack_38;
  WinNE_HeaderRec ne_header;
  FT_Long face_index;
  FT_Memory pFStack_28;
  WinMZ_HeaderRec mz_header;
  FT_Memory memory;
  FT_Stream stream;
  FT_Error error;
  FT_Int face_instance_index_local;
  FNT_Face face_local;
  
  stream_00 = (face->root).stream;
  pFStack_28 = (face->root).memory;
  face->font = (FNT_Font)0x0;
  local_15c = face_instance_index;
  if (face_instance_index < 0) {
    local_15c = -face_instance_index;
  }
  lStack_38 = (long)(int)(local_15c & 0xffff);
  stream._4_4_ = face_instance_index;
  _error = face;
  stream._0_4_ = FT_Stream_Seek(stream_00,0);
  if (((FT_Error)stream != 0) ||
     (FVar4 = FT_Stream_ReadFields(stream_00,winmz_header_fields,(void *)((long)&face_index + 4)),
     FVar4 != 0)) {
    return 2;
  }
  stream._0_4_ = 2;
  if (face_index._4_2_ == 0x5a4d) {
    stream._0_4_ = FT_Stream_Seek(stream_00,(ulong)face_index._6_2_);
    if ((FT_Error)stream != 0) {
      return (FT_Error)stream;
    }
    FVar4 = FT_Stream_ReadFields(stream_00,winne_header_fields,(void *)((long)&res_offset + 2));
    if (FVar4 != 0) {
      return FVar4;
    }
    stream._0_4_ = 2;
    if (res_offset._2_2_ == 0x454e) {
      font_offset._4_2_ = 0;
      puStack_58 = (uchar *)0x0;
      stream._0_4_ = FT_Stream_Seek(stream_00,
                                    (long)(int)((uint)face_index._6_2_ + (uint)res_offset._4_2_));
      if ((FT_Error)stream != 0) {
        return (FT_Error)stream;
      }
      stream._0_4_ = FT_Stream_EnterFrame
                               (stream_00,
                                (long)(int)((uint)res_offset._6_2_ - (uint)res_offset._4_2_));
      if ((FT_Error)stream != 0) {
        return (FT_Error)stream;
      }
      FVar1 = FT_Stream_GetUShortLE(stream_00);
      if (0x10 < FVar1) {
        stream._0_4_ = 3;
        FT_Stream_ExitFrame(stream_00);
        return (FT_Error)stream;
      }
      while (FVar2 = FT_Stream_GetUShortLE(stream_00), FVar2 != 0) {
        FVar3 = FT_Stream_GetUShortLE(stream_00);
        if (FVar2 == 0x8008) {
          FVar5 = FT_Stream_Pos(stream_00);
          puStack_58 = stream_00->cursor + ((FVar5 + 4) - (long)stream_00->limit);
          font_offset._4_2_ = FVar3;
          break;
        }
        stream_00->cursor = stream_00->cursor + (int)((uint)FVar3 * 0xc + 4);
      }
      FT_Stream_ExitFrame(stream_00);
      if ((font_offset._4_2_ == 0) || (puStack_58 == (uchar *)0x0)) {
        return 3;
      }
      if (stream_00->size <= (ulong)font_offset._4_2_ * 0x76 &&
          (ulong)font_offset._4_2_ * 0x76 - stream_00->size != 0) {
        return 3;
      }
      (_error->root).num_faces = (ulong)font_offset._4_2_;
      if (stream._4_4_ < 0) {
        return (FT_Error)stream;
      }
      if ((long)(ulong)font_offset._4_2_ <= lStack_38) {
        return 6;
      }
      pFVar6 = (FNT_Font)ft_mem_alloc(pFStack_28,0xf0,(FT_Error *)&stream);
      _error->font = pFVar6;
      if ((FT_Error)stream != 0) {
        return (FT_Error)stream;
      }
      stream._0_4_ = FT_Stream_Seek(stream_00,(FT_ULong)(puStack_58 + lStack_38 * 0xc));
      if (((FT_Error)stream != 0) ||
         (stream._0_4_ = FT_Stream_EnterFrame(stream_00,0xc), (FT_Error)stream != 0))
      goto LAB_00367840;
      FVar2 = FT_Stream_GetUShortLE(stream_00);
      _error->font->offset = (ulong)FVar2 << ((byte)FVar1 & 0x3f);
      FVar2 = FT_Stream_GetUShortLE(stream_00);
      _error->font->fnt_size = (ulong)FVar2 << ((byte)FVar1 & 0x3f);
      stream_00->cursor = stream_00->cursor + 8;
      FT_Stream_ExitFrame(stream_00);
      stream._0_4_ = fnt_font_load(_error->font,stream_00);
    }
    else if (res_offset._2_2_ == 0x4550) {
      stream._0_4_ = FT_Stream_Seek(stream_00,(ulong)face_index._6_2_);
      if ((FT_Error)stream != 0) {
        return (FT_Error)stream;
      }
      FVar4 = FT_Stream_ReadFields
                        (stream_00,winpe32_header_fields,&pe32_section.pointer_to_raw_data);
      if (FVar4 != 0) {
        return FVar4;
      }
      if ((((pe32_section.pointer_to_raw_data != 0x4550) || ((short)pe32_header.magic != 0x14c)) ||
          (pe32_header.magic._4_2_ != 0xe0)) || (pe32_header.magic._6_2_ != 0x10b)) {
        return 3;
      }
      (_error->root).num_faces = 0;
      local_152 = 0;
      while( true ) {
        stream._0_4_ = 0;
        if (pe32_header.magic._2_2_ <= local_152) {
          return 3;
        }
        stream._0_4_ = FT_Stream_ReadFields
                                 (stream_00,winpe32_section_fields,&root_dir.major_version);
        if ((FT_Error)stream != 0) {
          return (FT_Error)stream;
        }
        if ((FT_Byte  [8])pe32_header._8_8_ == pe32_section.name) break;
        local_152 = local_152 + 1;
      }
      stream._0_4_ = FT_Stream_Seek(stream_00,pe32_section.size_of_raw_data);
      if ((FT_Error)stream != 0) {
        return (FT_Error)stream;
      }
      FVar4 = FT_Stream_ReadFields(stream_00,winpe_rsrc_dir_fields,&name_dir.major_version);
      FVar5 = pe32_section.size_of_raw_data;
      if (FVar4 != 0) {
        return FVar4;
      }
      stream._0_4_ = 0;
      for (local_152 = 0;
          (uint)local_152 <
          (uint)root_dir.time_date_stamp._4_2_ + (uint)root_dir.time_date_stamp._6_2_;
          local_152 = local_152 + 1) {
        stream._0_4_ = FT_Stream_Seek(stream_00,FVar5 + 0x10 + (long)(int)((uint)local_152 << 3));
        if ((FT_Error)stream != 0) {
          return (FT_Error)stream;
        }
        stream._0_4_ = FT_Stream_ReadFields
                                 (stream_00,winpe_rsrc_dir_entry_fields,&dir_entry2.offset);
        if ((FT_Error)stream != 0) {
          return (FT_Error)stream;
        }
        if ((dir_entry1.name & 0x80000000) == 0) {
          return 3;
        }
        dir_entry1.name = dir_entry1.name & 0xffffffff7fffffff;
        lVar7 = pe32_section.size_of_raw_data + dir_entry1.name;
        stream._0_4_ = FT_Stream_Seek(stream_00,pe32_section.size_of_raw_data + dir_entry1.name);
        if ((FT_Error)stream != 0) {
          return (FT_Error)stream;
        }
        FVar4 = FT_Stream_ReadFields(stream_00,winpe_rsrc_dir_fields,&lang_dir.major_version);
        if (FVar4 != 0) {
          return FVar4;
        }
        stream._0_4_ = 0;
        for (local_154 = 0;
            (uint)local_154 <
            (uint)name_dir.time_date_stamp._4_2_ + (uint)name_dir.time_date_stamp._6_2_;
            local_154 = local_154 + 1) {
          stream._0_4_ = FT_Stream_Seek(stream_00,lVar7 + 0x10 + (long)(int)((uint)local_154 << 3));
          if ((FT_Error)stream != 0) {
            return (FT_Error)stream;
          }
          stream._0_4_ = FT_Stream_ReadFields
                                   (stream_00,winpe_rsrc_dir_entry_fields,&dir_entry3.offset);
          if ((FT_Error)stream != 0) {
            return (FT_Error)stream;
          }
          if ((dir_entry2.name & 0x80000000) == 0) {
            return 3;
          }
          dir_entry2.name = dir_entry2.name & 0xffffffff7fffffff;
          lVar8 = pe32_section.size_of_raw_data + dir_entry2.name;
          stream._0_4_ = FT_Stream_Seek(stream_00,pe32_section.size_of_raw_data + dir_entry2.name);
          if ((FT_Error)stream != 0) {
            return (FT_Error)stream;
          }
          FVar4 = FT_Stream_ReadFields(stream_00,winpe_rsrc_dir_fields,&dir_entry1.offset);
          if (FVar4 != 0) {
            return FVar4;
          }
          stream._0_4_ = 0;
          for (local_156 = 0;
              (uint)local_156 <
              (uint)lang_dir.time_date_stamp._4_2_ + (uint)lang_dir.time_date_stamp._6_2_;
              local_156 = local_156 + 1) {
            stream._0_4_ = FT_Stream_Seek(stream_00,lVar8 + 0x10 + (long)(int)((uint)local_156 << 3)
                                         );
            if ((FT_Error)stream != 0) {
              return (FT_Error)stream;
            }
            stream._0_4_ = FT_Stream_ReadFields
                                     (stream_00,winpe_rsrc_dir_entry_fields,&data_entry.reserved);
            if ((FT_Error)stream != 0) {
              return (FT_Error)stream;
            }
            if ((dir_entry2.name & 0x80000000) != 0) {
              return 3;
            }
            FVar4 = 0;
            if (dir_entry2.offset == 8) {
              stream._0_4_ = FT_Stream_Seek(stream_00,FVar5 + dir_entry3.name);
              if ((FT_Error)stream != 0) {
                return (FT_Error)stream;
              }
              stream._0_4_ = FT_Stream_ReadFields
                                       (stream_00,winpe_rsrc_data_entry_fields,&root_dir_offset);
              if ((FT_Error)stream != 0) {
                return (FT_Error)stream;
              }
              FVar4 = 0;
              if (lStack_38 == (_error->root).num_faces) {
                pFVar6 = (FNT_Font)ft_mem_alloc(pFStack_28,0xf0,(FT_Error *)&stream);
                _error->font = pFVar6;
                if ((FT_Error)stream != 0) {
                  return (FT_Error)stream;
                }
                _error->font->offset =
                     (pe32_section.size_of_raw_data + root_dir_offset) - (long)pe32_section.name;
                _error->font->fnt_size = data_entry.offset_to_data;
                stream._0_4_ = fnt_font_load(_error->font,stream_00);
                FVar4 = (FT_Error)stream;
                if ((FT_Error)stream != 0) goto LAB_00367840;
              }
              stream._0_4_ = FVar4;
              (_error->root).num_faces = (_error->root).num_faces + 1;
              FVar4 = (FT_Error)stream;
            }
            stream._0_4_ = FVar4;
          }
        }
      }
    }
    if ((_error->root).num_faces == 0) {
      return 3;
    }
    if ((_error->root).num_faces <= lStack_38) {
      return 6;
    }
  }
LAB_00367840:
  if ((FT_Error)stream != 0) {
    fnt_font_done(_error);
  }
  return (FT_Error)stream;
}

Assistant:

static FT_Error
  fnt_face_get_dll_font( FNT_Face  face,
                         FT_Int    face_instance_index )
  {
    FT_Error         error;
    FT_Stream        stream = FT_FACE( face )->stream;
    FT_Memory        memory = FT_FACE( face )->memory;
    WinMZ_HeaderRec  mz_header;
    FT_Long          face_index;


    face->font = NULL;

    face_index = FT_ABS( face_instance_index ) & 0xFFFF;

    /* does it begin with an MZ header? */
    if ( FT_STREAM_SEEK( 0 )                                      ||
         FT_STREAM_READ_FIELDS( winmz_header_fields, &mz_header ) )
    {
      error = FT_ERR( Unknown_File_Format );
      goto Exit;
    }

    error = FT_ERR( Unknown_File_Format );
    if ( mz_header.magic == WINFNT_MZ_MAGIC )
    {
      /* yes, now look for an NE header in the file */
      WinNE_HeaderRec  ne_header;


      FT_TRACE2(( "MZ signature found\n" ));

      if ( FT_STREAM_SEEK( mz_header.lfanew )                       ||
           FT_STREAM_READ_FIELDS( winne_header_fields, &ne_header ) )
        goto Exit;

      error = FT_ERR( Unknown_File_Format );
      if ( ne_header.magic == WINFNT_NE_MAGIC )
      {
        /* good, now look into the resource table for each FNT resource */
        FT_ULong   res_offset  = mz_header.lfanew +
                                   ne_header.resource_tab_offset;
        FT_UShort  size_shift;
        FT_UShort  font_count  = 0;
        FT_ULong   font_offset = 0;


        FT_TRACE2(( "NE signature found\n" ));

        if ( FT_STREAM_SEEK( res_offset )                    ||
             FT_FRAME_ENTER( ne_header.rname_tab_offset -
                             ne_header.resource_tab_offset ) )
          goto Exit;

        size_shift = FT_GET_USHORT_LE();

        /* Microsoft's specification of the executable-file header format */
        /* for `New Executable' (NE) doesn't give a limit for the         */
        /* alignment shift count; however, in 1985, the year of the       */
        /* specification release, only 32bit values were supported, thus  */
        /* anything larger than 16 doesn't make sense in general, given   */
        /* that file offsets are 16bit values, shifted by the alignment   */
        /* shift count                                                    */
        if ( size_shift > 16 )
        {
          FT_TRACE2(( "invalid alignment shift count for resource data\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Exit1;
        }


        for (;;)
        {
          FT_UShort  type_id, count;


          type_id = FT_GET_USHORT_LE();
          if ( !type_id )
            break;

          count = FT_GET_USHORT_LE();

          FT_TRACE2(( type_id == 0x8007U ? "RT_FONTDIR count %hu\n" :
                      type_id == 0x8008U ? "RT_FONT count %hu\n" : "",
                                           count ));

          if ( type_id == 0x8008U )
          {
            font_count  = count;
            font_offset = FT_STREAM_POS() + 4 +
                          (FT_ULong)( stream->cursor - stream->limit );
            break;
          }

          stream->cursor += 4 + count * 12;
        }

        FT_FRAME_EXIT();

        if ( !font_count || !font_offset )
        {
          FT_TRACE2(( "this file doesn't contain any FNT resources\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        /* loading `winfnt_header_fields' needs at least 118 bytes;    */
        /* use this as a rough measure to check the expected font size */
        if ( font_count * 118UL > stream->size )
        {
          FT_TRACE2(( "invalid number of faces\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        face->root.num_faces = font_count;

        if ( face_instance_index < 0 )
          goto Exit;

        if ( face_index >= font_count )
        {
          error = FT_THROW( Invalid_Argument );
          goto Exit;
        }

        if ( FT_NEW( face->font ) )
          goto Exit;

        if ( FT_STREAM_SEEK( font_offset + (FT_ULong)face_index * 12 ) ||
             FT_FRAME_ENTER( 12 )                                      )
          goto Fail;

        face->font->offset   = (FT_ULong)FT_GET_USHORT_LE() << size_shift;
        face->font->fnt_size = (FT_ULong)FT_GET_USHORT_LE() << size_shift;

        stream->cursor += 8;

        FT_FRAME_EXIT();

        error = fnt_font_load( face->font, stream );
      }
      else if ( ne_header.magic == WINFNT_PE_MAGIC )
      {
        WinPE32_HeaderRec       pe32_header;
        WinPE32_SectionRec      pe32_section;
        WinPE_RsrcDirRec        root_dir, name_dir, lang_dir;
        WinPE_RsrcDirEntryRec   dir_entry1, dir_entry2, dir_entry3;
        WinPE_RsrcDataEntryRec  data_entry;

        FT_ULong   root_dir_offset, name_dir_offset, lang_dir_offset;
        FT_UShort  i, j, k;


        FT_TRACE2(( "PE signature found\n" ));

        if ( FT_STREAM_SEEK( mz_header.lfanew )                           ||
             FT_STREAM_READ_FIELDS( winpe32_header_fields, &pe32_header ) )
          goto Exit;

        FT_TRACE2(( "magic %04lx, machine %02x, number_of_sections %u, "
                    "size_of_optional_header %02x\n",
                    pe32_header.magic, pe32_header.machine,
                    pe32_header.number_of_sections,
                    pe32_header.size_of_optional_header ));
        FT_TRACE2(( "magic32 %02x, rsrc_virtual_address %04lx, "
                    "rsrc_size %04lx\n",
                    pe32_header.magic32, pe32_header.rsrc_virtual_address,
                    pe32_header.rsrc_size ));

        if ( pe32_header.magic != WINFNT_PE_MAGIC /* check full signature */ ||
             pe32_header.machine != 0x014C /* i386 */                        ||
             pe32_header.size_of_optional_header != 0xE0 /* FIXME */         ||
             pe32_header.magic32 != 0x10B                                    )
        {
          FT_TRACE2(( "this file has an invalid PE header\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        face->root.num_faces = 0;

        for ( i = 0; i < pe32_header.number_of_sections; i++ )
        {
          if ( FT_STREAM_READ_FIELDS( winpe32_section_fields,
                                      &pe32_section ) )
            goto Exit;

          FT_TRACE2(( "name %.8s, va %04lx, size %04lx, offset %04lx\n",
                      pe32_section.name, pe32_section.virtual_address,
                      pe32_section.size_of_raw_data,
                      pe32_section.pointer_to_raw_data ));

          if ( pe32_header.rsrc_virtual_address ==
                 pe32_section.virtual_address )
            goto Found_rsrc_section;
        }

        FT_TRACE2(( "this file doesn't contain any resources\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;

      Found_rsrc_section:
        FT_TRACE2(( "found resources section %.8s\n", pe32_section.name ));

        if ( FT_STREAM_SEEK( pe32_section.pointer_to_raw_data )        ||
             FT_STREAM_READ_FIELDS( winpe_rsrc_dir_fields, &root_dir ) )
          goto Exit;

        root_dir_offset = pe32_section.pointer_to_raw_data;

        for ( i = 0; i < root_dir.number_of_named_entries +
                           root_dir.number_of_id_entries; i++ )
        {
          if ( FT_STREAM_SEEK( root_dir_offset + 16 + i * 8 )      ||
               FT_STREAM_READ_FIELDS( winpe_rsrc_dir_entry_fields,
                                      &dir_entry1 )                )
            goto Exit;

          if ( !( dir_entry1.offset & 0x80000000UL ) /* DataIsDirectory */ )
          {
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          dir_entry1.offset &= ~0x80000000UL;

          name_dir_offset = pe32_section.pointer_to_raw_data +
                            dir_entry1.offset;

          if ( FT_STREAM_SEEK( pe32_section.pointer_to_raw_data +
                               dir_entry1.offset )                       ||
               FT_STREAM_READ_FIELDS( winpe_rsrc_dir_fields, &name_dir ) )
            goto Exit;

          for ( j = 0; j < name_dir.number_of_named_entries +
                             name_dir.number_of_id_entries; j++ )
          {
            if ( FT_STREAM_SEEK( name_dir_offset + 16 + j * 8 )      ||
                 FT_STREAM_READ_FIELDS( winpe_rsrc_dir_entry_fields,
                                        &dir_entry2 )                )
              goto Exit;

            if ( !( dir_entry2.offset & 0x80000000UL ) /* DataIsDirectory */ )
            {
              error = FT_THROW( Invalid_File_Format );
              goto Exit;
            }

            dir_entry2.offset &= ~0x80000000UL;

            lang_dir_offset = pe32_section.pointer_to_raw_data +
                                dir_entry2.offset;

            if ( FT_STREAM_SEEK( pe32_section.pointer_to_raw_data +
                                   dir_entry2.offset )                     ||
                 FT_STREAM_READ_FIELDS( winpe_rsrc_dir_fields, &lang_dir ) )
              goto Exit;

            for ( k = 0; k < lang_dir.number_of_named_entries +
                               lang_dir.number_of_id_entries; k++ )
            {
              if ( FT_STREAM_SEEK( lang_dir_offset + 16 + k * 8 )      ||
                   FT_STREAM_READ_FIELDS( winpe_rsrc_dir_entry_fields,
                                          &dir_entry3 )                )
                goto Exit;

              if ( dir_entry2.offset & 0x80000000UL /* DataIsDirectory */ )
              {
                error = FT_THROW( Invalid_File_Format );
                goto Exit;
              }

              if ( dir_entry1.name == 8 /* RT_FONT */ )
              {
                if ( FT_STREAM_SEEK( root_dir_offset + dir_entry3.offset ) ||
                     FT_STREAM_READ_FIELDS( winpe_rsrc_data_entry_fields,
                                            &data_entry )                  )
                  goto Exit;

                FT_TRACE2(( "found font #%lu, offset %04lx, "
                            "size %04lx, cp %lu\n",
                            dir_entry2.name,
                            pe32_section.pointer_to_raw_data +
                              data_entry.offset_to_data -
                              pe32_section.virtual_address,
                            data_entry.size, data_entry.code_page ));

                if ( face_index == face->root.num_faces )
                {
                  if ( FT_NEW( face->font ) )
                    goto Exit;

                  face->font->offset   = pe32_section.pointer_to_raw_data +
                                           data_entry.offset_to_data -
                                           pe32_section.virtual_address;
                  face->font->fnt_size = data_entry.size;

                  error = fnt_font_load( face->font, stream );
                  if ( error )
                  {
                    FT_TRACE2(( "font #%lu load error 0x%x\n",
                                dir_entry2.name, error ));
                    goto Fail;
                  }
                  else
                    FT_TRACE2(( "font #%lu successfully loaded\n",
                                dir_entry2.name ));
                }

                face->root.num_faces++;
              }
            }
          }
        }
      }

      if ( !face->root.num_faces )
      {
        FT_TRACE2(( "this file doesn't contain any RT_FONT resources\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      if ( face_index >= face->root.num_faces )
      {
        error = FT_THROW( Invalid_Argument );
        goto Exit;
      }
    }

  Fail:
    if ( error )
      fnt_font_done( face );

  Exit:
    return error;

  Exit1:
    FT_FRAME_EXIT();
    goto Exit;
  }